

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena_unittest.cc
# Opt level: O2

void __thiscall
google::protobuf::ArenaTest_CopyValuesWithinOneof_Test::TestBody
          (ArenaTest_CopyValuesWithinOneof_Test *this)

{
  uint32_t uVar1;
  ulong uVar2;
  TestOneof *this_00;
  TestOneof_FooGroup *pTVar3;
  undefined8 *puVar4;
  undefined1 *puVar5;
  Arena *pAVar6;
  string *psVar7;
  char *in_R9;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_100;
  AssertHelper local_f8;
  string local_f0;
  AssertionResult gtest_ar_;
  Arena arena;
  
  internal::ThreadSafeArena::ThreadSafeArena(&arena.impl_);
  this_00 = (TestOneof *)Arena::DefaultConstruct<proto2_unittest::TestOneof>((Arena *)&arena.impl_);
  pTVar3 = proto2_unittest::TestOneof::_internal_mutable_foogroup(this_00);
  (pTVar3->field_0)._impl_.a_ = 100;
  *(byte *)&pTVar3->field_0 = *(byte *)&pTVar3->field_0 | 3;
  pAVar6 = (Arena *)(pTVar3->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if (((ulong)pAVar6 & 1) != 0) {
    pAVar6 = *(Arena **)((ulong)pAVar6 & 0xfffffffffffffffe);
  }
  internal::ArenaStringPtr::Set(&(pTVar3->field_0)._impl_.b_,"hello world",pAVar6);
  uVar1 = (this_00->field_0)._impl_._oneof_case_[0];
  if (uVar1 == 4) {
    puVar5 = (undefined1 *)(this_00->field_0)._impl_.foo_.foo_message_;
  }
  else {
    puVar5 = proto2_unittest::_TestOneof_FooGroup_default_instance_;
  }
  uVar2 = *(ulong *)((long)&((TestAllTypes *)puVar5)->field_0 + 8);
  if (uVar1 != 2) {
    proto2_unittest::TestOneof::clear_foo(this_00);
    (this_00->field_0)._impl_._oneof_case_[0] = 2;
    (this_00->field_0)._impl_.foo_.foo_message_ =
         (TestAllTypes *)&internal::fixed_address_empty_string;
  }
  pAVar6 = (Arena *)(this_00->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if (((ulong)pAVar6 & 1) != 0) {
    pAVar6 = *(Arena **)((ulong)pAVar6 & 0xfffffffffffffffe);
  }
  internal::ArenaStringPtr::Set<>
            ((ArenaStringPtr *)&(this_00->field_0)._impl_,(string *)(uVar2 & 0xfffffffffffffffc),
             pAVar6);
  if ((this_00->field_0)._impl_._oneof_case_[0] == 2) {
    puVar4 = (undefined8 *)((ulong)(this_00->field_0)._impl_.foo_.foo_message_ & 0xfffffffffffffffc)
    ;
  }
  else {
    puVar4 = &internal::fixed_address_empty_string;
  }
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  gtest_ar_.success_ = puVar4[1] == 0;
  if (!gtest_ar_.success_) {
    testing::Message::Message((Message *)&local_100);
    if ((this_00->field_0)._impl_._oneof_case_[0] == 2) {
      psVar7 = (string *)((ulong)(this_00->field_0)._impl_.foo_.foo_message_ & 0xfffffffffffffffc);
    }
    else {
      psVar7 = (string *)&internal::fixed_address_empty_string;
    }
    std::operator<<((ostream *)(local_100._M_head_impl + 0x10),psVar7);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_f0,(internal *)&gtest_ar_,(AssertionResult *)"message->foo_string().empty()",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/arena_unittest.cc"
               ,0x61f,local_f0._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_f8,(Message *)&local_100);
    testing::internal::AssertHelper::~AssertHelper(&local_f8);
    std::__cxx11::string::~string((string *)&local_f0);
    if (local_100._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_100._M_head_impl + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_.message_);
  internal::ThreadSafeArena::~ThreadSafeArena(&arena.impl_);
  return;
}

Assistant:

TEST(ArenaTest, CopyValuesWithinOneof) {
  if (!internal::DebugHardenClearOneofMessageOnArena()) {
    GTEST_SKIP() << "arena allocated oneof message fields are not hardened.";
  }

  Arena arena;
  auto* message = Arena::Create<unittest::TestOneof>(&arena);
  auto* foo = message->mutable_foogroup();
  foo->set_a(100);
  foo->set_b("hello world");
  message->set_foo_string(message->foogroup().b());

  // As a debug hardening measure, `set_foo_string` would clear `foo` in
  // (!NDEBUG && !ASAN) and the copy wouldn't work.
  EXPECT_TRUE(message->foo_string().empty()) << message->foo_string();
}